

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sv.c
# Opt level: O1

int control(char *a)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  ssize_t sVar4;
  int *piVar5;
  char *m1;
  char *p;
  
  iVar2 = svstatus_get();
  if (0 < iVar2) {
    if (svstatus[0x11] == *a) {
      if (*a != 'd') {
        return 0;
      }
      if (svstatus[0x12] == '\x01') {
        return 0;
      }
    }
    iVar2 = open_write("supervise/control");
    fd = iVar2;
    if (iVar2 == -1) {
      piVar5 = __errno_location();
      if (*piVar5 == error_nodevice) {
        cVar1 = *a;
        *piVar5 = 0;
        if (cVar1 == 'x') {
          p = "ok: ";
        }
        else {
          rc = rc + 1;
          p = "fail: ";
        }
        m1 = "runsv not running";
      }
      else {
        rc = rc + 1;
        p = "warning: ";
        m1 = "unable to open supervise/control";
      }
    }
    else {
      uVar3 = str_len(a);
      sVar4 = write(iVar2,a,(ulong)uVar3);
      r = (int)sVar4;
      close(fd);
      iVar2 = r;
      uVar3 = str_len(a);
      if (iVar2 == uVar3) {
        return 1;
      }
      rc = rc + 1;
      p = "warning: ";
      m1 = "unable to write to supervise/control";
    }
    out(p,m1);
  }
  return -1;
}

Assistant:

int control(char *a) {
  if (svstatus_get() <= 0) return(-1);
  if (svstatus[17] == *a)
    if (*a != 'd' || svstatus[18] == 1) return(0); /* once w/o term */
  if ((fd =open_write("supervise/control")) == -1) {
    if (errno != error_nodevice)
      warn("unable to open supervise/control");
    else
      *a == 'x' ? ok("runsv not running") : failx("runsv not running");
    return(-1);
  }
  r =write(fd, a, str_len(a));
  close(fd);
  if (r != str_len(a)) {
    warn("unable to write to supervise/control");
    return(-1);
  }
  return(1);
}